

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O0

void blake256_final_h(state_conflict *S,uint8_t *digest,uint8_t pa,uint8_t pb)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  uint uVar9;
  undefined1 in_CL;
  undefined1 in_DL;
  state_conflict *in_RSI;
  undefined4 *in_RDI;
  uint32_t hi;
  uint32_t lo;
  uint8_t msglen [8];
  int local_24;
  undefined2 in_stack_ffffffffffffffe4;
  
  uVar9 = in_RDI[0xc] + in_RDI[0xe];
  local_24 = in_RDI[0xd];
  if (uVar9 < (uint)in_RDI[0xe]) {
    local_24 = local_24 + 1;
  }
  uVar1 = (undefined1)((uint)local_24 >> 0x18);
  uVar2 = (undefined1)((uint)local_24 >> 0x10);
  uVar3 = (undefined1)((uint)local_24 >> 8);
  uVar4 = (undefined1)local_24;
  uVar5 = (undefined1)(uVar9 >> 0x18);
  uVar6 = (undefined1)(uVar9 >> 0x10);
  uVar7 = (undefined1)(uVar9 >> 8);
  uVar8 = (undefined1)uVar9;
  if (in_RDI[0xe] == 0x1b8) {
    in_RDI[0xc] = in_RDI[0xc] + -8;
    blake256_update(in_RSI,(uint8_t *)
                           CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(
                                                  uVar6,CONCAT12(uVar5,CONCAT11(uVar4,uVar3))))))),
                    CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar9))));
  }
  else {
    if ((int)in_RDI[0xe] < 0x1b8) {
      if (in_RDI[0xe] == 0) {
        in_RDI[0xf] = 1;
      }
      in_RDI[0xc] = in_RDI[0xc] - (0x1b8 - in_RDI[0xe]);
      blake256_update(in_RSI,(uint8_t *)
                             CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(
                                                  uVar6,CONCAT12(uVar5,CONCAT11(uVar4,uVar3))))))),
                      CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar9))));
    }
    else {
      in_RDI[0xc] = in_RDI[0xc] - (0x200 - in_RDI[0xe]);
      blake256_update(in_RSI,(uint8_t *)
                             CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(
                                                  uVar6,CONCAT12(uVar5,CONCAT11(uVar4,uVar3))))))),
                      CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar9))));
      in_RDI[0xc] = in_RDI[0xc] + -0x1b8;
      blake256_update(in_RSI,(uint8_t *)
                             CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(
                                                  uVar6,CONCAT12(uVar5,CONCAT11(uVar4,uVar3))))))),
                      CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar9))));
      in_RDI[0xf] = 1;
    }
    blake256_update(in_RSI,(uint8_t *)
                           CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(
                                                  uVar6,CONCAT12(uVar5,CONCAT11(uVar4,uVar3))))))),
                    CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar9))));
    in_RDI[0xc] = in_RDI[0xc] + -8;
  }
  in_RDI[0xc] = in_RDI[0xc] + -0x40;
  blake256_update(in_RSI,(uint8_t *)
                         CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(uVar8,CONCAT14(uVar7,CONCAT13(uVar6,
                                                  CONCAT12(uVar5,CONCAT11(uVar4,uVar3))))))),
                  CONCAT17(uVar2,CONCAT16(uVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar9))));
  *(char *)in_RSI->h = (char)((uint)*in_RDI >> 0x18);
  *(char *)((long)in_RSI->h + 1) = (char)((uint)*in_RDI >> 0x10);
  *(char *)((long)in_RSI->h + 2) = (char)((uint)*in_RDI >> 8);
  *(char *)((long)in_RSI->h + 3) = (char)*in_RDI;
  *(char *)(in_RSI->h + 1) = (char)((uint)in_RDI[1] >> 0x18);
  *(char *)((long)in_RSI->h + 5) = (char)((uint)in_RDI[1] >> 0x10);
  *(char *)((long)in_RSI->h + 6) = (char)((uint)in_RDI[1] >> 8);
  *(char *)((long)in_RSI->h + 7) = (char)in_RDI[1];
  *(char *)(in_RSI->h + 2) = (char)((uint)in_RDI[2] >> 0x18);
  *(char *)((long)in_RSI->h + 9) = (char)((uint)in_RDI[2] >> 0x10);
  *(char *)((long)in_RSI->h + 10) = (char)((uint)in_RDI[2] >> 8);
  *(char *)((long)in_RSI->h + 0xb) = (char)in_RDI[2];
  *(char *)(in_RSI->h + 3) = (char)((uint)in_RDI[3] >> 0x18);
  *(char *)((long)in_RSI->h + 0xd) = (char)((uint)in_RDI[3] >> 0x10);
  *(char *)((long)in_RSI->h + 0xe) = (char)((uint)in_RDI[3] >> 8);
  *(char *)((long)in_RSI->h + 0xf) = (char)in_RDI[3];
  *(char *)(in_RSI->h + 4) = (char)((uint)in_RDI[4] >> 0x18);
  *(char *)((long)in_RSI->h + 0x11) = (char)((uint)in_RDI[4] >> 0x10);
  *(char *)((long)in_RSI->h + 0x12) = (char)((uint)in_RDI[4] >> 8);
  *(char *)((long)in_RSI->h + 0x13) = (char)in_RDI[4];
  *(char *)(in_RSI->h + 5) = (char)((uint)in_RDI[5] >> 0x18);
  *(char *)((long)in_RSI->h + 0x15) = (char)((uint)in_RDI[5] >> 0x10);
  *(char *)((long)in_RSI->h + 0x16) = (char)((uint)in_RDI[5] >> 8);
  *(char *)((long)in_RSI->h + 0x17) = (char)in_RDI[5];
  *(char *)(in_RSI->h + 6) = (char)((uint)in_RDI[6] >> 0x18);
  *(char *)((long)in_RSI->h + 0x19) = (char)((uint)in_RDI[6] >> 0x10);
  *(char *)((long)in_RSI->h + 0x1a) = (char)((uint)in_RDI[6] >> 8);
  *(char *)((long)in_RSI->h + 0x1b) = (char)in_RDI[6];
  *(char *)(in_RSI->h + 7) = (char)((uint)in_RDI[7] >> 0x18);
  *(char *)((long)in_RSI->h + 0x1d) = (char)((uint)in_RDI[7] >> 0x10);
  *(char *)((long)in_RSI->h + 0x1e) = (char)((uint)in_RDI[7] >> 8);
  *(char *)((long)in_RSI->h + 0x1f) = (char)in_RDI[7];
  return;
}

Assistant:

void blake256_final_h(state *S, uint8_t *digest, uint8_t pa, uint8_t pb) {
    uint8_t msglen[8];
    uint32_t lo = S->t[0] + S->buflen, hi = S->t[1];
    if (lo < (unsigned) S->buflen) hi++;
    U32TO8(msglen + 0, hi);
    U32TO8(msglen + 4, lo);

    if (S->buflen == 440) { /* one padding byte */
        S->t[0] -= 8;
        blake256_update(S, &pa, 8);
    } else {
        if (S->buflen < 440) { /* enough space to fill the block  */
            if (S->buflen == 0) S->nullt = 1;
            S->t[0] -= 440 - S->buflen;
            blake256_update(S, padding, 440 - S->buflen);
        } else { /* need 2 compressions */
            S->t[0] -= 512 - S->buflen;
            blake256_update(S, padding, 512 - S->buflen);
            S->t[0] -= 440;
            blake256_update(S, padding + 1, 440);
            S->nullt = 1;
        }
        blake256_update(S, &pb, 8);
        S->t[0] -= 8;
    }
    S->t[0] -= 64;
    blake256_update(S, msglen, 64);

    U32TO8(digest +  0, S->h[0]);
    U32TO8(digest +  4, S->h[1]);
    U32TO8(digest +  8, S->h[2]);
    U32TO8(digest + 12, S->h[3]);
    U32TO8(digest + 16, S->h[4]);
    U32TO8(digest + 20, S->h[5]);
    U32TO8(digest + 24, S->h[6]);
    U32TO8(digest + 28, S->h[7]);
}